

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiffReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::TextDiffReporter::report(TextDiffReporter *this,string *received,string *approved)

{
  Reporter *pRVar1;
  int iVar2;
  ostream *poVar3;
  string asStack_68 [32];
  string local_48 [32];
  
  poVar3 = ::std::operator<<(this->stream_,"Comparing files:");
  ::std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = ::std::operator<<(this->stream_,"received: ");
  poVar3 = ::std::operator<<(poVar3,(string *)received);
  ::std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = ::std::operator<<(this->stream_,"approved: ");
  poVar3 = ::std::operator<<(poVar3,(string *)approved);
  ::std::endl<char,std::char_traits<char>>(poVar3);
  pRVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_ApprovalTests::Reporter_*,_std::default_delete<ApprovalTests::Reporter>_>
           .super__Head_base<0UL,_ApprovalTests::Reporter_*,_false>._M_head_impl;
  ::std::__cxx11::string::string(local_48,(string *)received);
  ::std::__cxx11::string::string(asStack_68,(string *)approved);
  iVar2 = (*pRVar1->_vptr_Reporter[2])(pRVar1,local_48,asStack_68);
  ::std::__cxx11::string::~string(asStack_68);
  ::std::__cxx11::string::~string(local_48);
  if (SUB41(iVar2,0) == false) {
    ::std::operator<<(this->stream_,"TextDiffReporter did not find a working diff program\n\n");
  }
  return SUB41(iVar2,0);
}

Assistant:

bool TextDiffReporter::report(std::string received, std::string approved) const
    {
        stream_ << "Comparing files:" << std::endl;
        stream_ << "received: " << received << std::endl;
        stream_ << "approved: " << approved << std::endl;
        const bool result = m_reporter->report(received, approved);
        if (!result)
        {
            stream_ << "TextDiffReporter did not find a working diff "
                       "program\n\n";
        }

        return result;
    }